

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::number_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this)

{
  AlphaNum *a;
  AlphaNum local_40;
  
  absl::lts_20250127::AlphaNum::AlphaNum(&local_40,this->descriptor_->number_);
  absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_40,a);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::number() {
  return absl::StrCat(descriptor_->number());
}